

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

unique_ptr<pm::Rectangle,_std::default_delete<pm::Rectangle>_>
rectangleFromVertices(Vector3 *pA,Vector3 *pB,Vector3 *pC)

{
  Rectangle *this;
  float *in_RCX;
  float fVar1;
  Vector3 local_44;
  Vector3 local_38;
  Vector3 local_2c;
  
  local_2c.x = pC->x - pB->x;
  local_2c.y = pC->y - pB->y;
  local_2c.z = pC->z - pB->z;
  local_38.x = *in_RCX - pB->x;
  local_38.y = in_RCX[1] - pB->y;
  local_38.z = in_RCX[2] - pB->z;
  local_44.x = local_2c.y * local_38.z - local_38.y * local_2c.z;
  local_44.y = local_2c.z * local_38.x - local_38.z * local_2c.x;
  local_44.z = local_38.y * local_2c.x - local_38.x * local_2c.y;
  fVar1 = local_44.z * local_44.z + local_44.x * local_44.x + local_44.y * local_44.y;
  if (fVar1 < 0.0) {
    fVar1 = sqrtf(fVar1);
  }
  else {
    fVar1 = SQRT(fVar1);
  }
  local_44.x = local_44.x / fVar1;
  local_44.y = local_44.y / fVar1;
  local_44.z = local_44.z / fVar1;
  this = (Rectangle *)operator_new(0x70);
  pm::Rectangle::Rectangle(this,pB,&local_2c,&local_38,&local_44);
  *(Rectangle **)pA = this;
  return (__uniq_ptr_data<pm::Rectangle,_std::default_delete<pm::Rectangle>,_true,_true>)
         (__uniq_ptr_data<pm::Rectangle,_std::default_delete<pm::Rectangle>,_true,_true>)pA;
}

Assistant:

std::unique_ptr<pm::Rectangle> rectangleFromVertices(const pm::Vector3 pA, const pm::Vector3 pB, const pm::Vector3 pC)
{
	auto rect = std::make_unique<pm::Rectangle>(pA, pB - pA, pC - pA, cross(pB - pA, pC - pA).normalize());
	return rect;
}